

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_http_server.c
# Opt level: O1

void test_timer_cancel_errors(void)

{
  cio_error cVar1;
  cio_inet_address *arg1;
  uint i;
  long lVar2;
  _func_cio_error_cio_timer_ptr *timer_cancel_fakes [3];
  cio_http_location target;
  cio_http_server_configuration config;
  cio_http_server server;
  _func_cio_error_cio_timer_ptr *local_278;
  code *local_270;
  code *local_268;
  cio_http_location local_258;
  cio_http_server_configuration local_238;
  cio_http_server local_180;
  
  lVar2 = 0;
  do {
    local_278 = cancel_timer;
    local_270 = cancel_timer;
    local_268 = cancel_timer;
    (&local_278)[lVar2] = cancel_timer_error;
    cio_timer_cancel_fake.custom_fake = (_func_cio_error_cio_timer_ptr *)0x0;
    cio_timer_cancel_fake.custom_fake_seq_len = 3;
    header_complete_fake.custom_fake = callback_write_ok_response;
    cio_timer_cancel_fake.custom_fake_seq = &local_278;
    memcpy(&local_238,&DAT_001199e0,0xb8);
    arg1 = cio_get_inet_address_any4();
    cio_init_inet_socket_address(&local_238.endpoint,arg1,0x1f90);
    cVar1 = cio_http_server_init(&local_180,&loop,&local_238);
    UnityAssertEqualNumber
              (0,(long)cVar1,"Server initialization failed!",0x73e,UNITY_DISPLAY_STYLE_INT);
    cVar1 = cio_http_location_init(&local_258,"/foo",(void *)0x0,alloc_dummy_handler);
    UnityAssertEqualNumber
              (0,(long)cVar1,"Request target initialization failed!",0x742,UNITY_DISPLAY_STYLE_INT);
    cVar1 = cio_http_server_register_location(&local_180,&local_258);
    UnityAssertEqualNumber
              (0,(long)cVar1,"Register request target failed!",0x744,UNITY_DISPLAY_STYLE_INT);
    split_request("GET /foo HTTP/1.1\r\n\r\n");
    cVar1 = cio_http_server_serve(&local_180);
    UnityAssertEqualNumber(0,(long)cVar1,"Serving http failed!",0x748,UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (1,(ulong)serve_error_fake.call_count,"Serve error callback was not called!",0x74a,
               UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (1,(ulong)cio_buffered_stream_close_fake.call_count,
               "buffered stream was not closed after keepalive timeout triggered!",0x74c,
               UNITY_DISPLAY_STYLE_INT);
    setUp();
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  free(&client_socket[-2].impl.close_timer.impl.ev.fd);
  return;
}

Assistant:

static void test_timer_cancel_errors(void)
{
	enum cio_error (*timer_cancel_fakes[3])(struct cio_timer *timer);

	for (unsigned int i = 0; i < ARRAY_SIZE(timer_cancel_fakes); i++) {
		timer_cancel_fakes[0] = cancel_timer;
		timer_cancel_fakes[1] = cancel_timer;
		timer_cancel_fakes[2] = cancel_timer;

		timer_cancel_fakes[i] = cancel_timer_error;

		cio_timer_cancel_fake.custom_fake = NULL;
		SET_CUSTOM_FAKE_SEQ(cio_timer_cancel, timer_cancel_fakes, ARRAY_SIZE(timer_cancel_fakes))

		header_complete_fake.custom_fake = callback_write_ok_response;

		struct cio_http_server_configuration config = {
		    .on_error = serve_error,
		    .read_header_timeout_ns = header_read_timeout,
		    .read_body_timeout_ns = body_read_timeout,
		    .response_timeout_ns = response_timeout,
		    .close_timeout_ns = 10,
		    .alloc_client = alloc_dummy_client,
		    .free_client = free_dummy_client};

		cio_init_inet_socket_address(&config.endpoint, cio_get_inet_address_any4(), 8080);

		struct cio_http_server server;
		enum cio_error err = cio_http_server_init(&server, &loop, &config);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Server initialization failed!");

		struct cio_http_location target;
		err = cio_http_location_init(&target, "/foo", NULL, alloc_dummy_handler);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Request target initialization failed!");
		err = cio_http_server_register_location(&server, &target);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Register request target failed!");

		split_request("GET /foo HTTP/1.1" CRLF CRLF);
		err = cio_http_server_serve(&server);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Serving http failed!");

		TEST_ASSERT_EQUAL_MESSAGE(1, serve_error_fake.call_count, "Serve error callback was not called!");

		TEST_ASSERT_EQUAL_MESSAGE(1, cio_buffered_stream_close_fake.call_count, "buffered stream was not closed after keepalive timeout triggered!");

		setUp();
	}

	free_dummy_client(client_socket);
}